

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_fasta.cpp
# Opt level: O1

bool __thiscall
BamTools::Fasta::FastaPrivate::GetNameFromHeader(FastaPrivate *this,string *header,string *name)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  string s;
  char *local_68 [2];
  char local_58 [16];
  undefined1 *local_48;
  ulong local_40;
  undefined1 local_38 [16];
  
  std::__cxx11::string::substr((ulong)&local_48,(ulong)header);
  uVar7 = 0;
  do {
    uVar3 = (uint)local_40;
    if ((0x20 < (ulong)(byte)local_48[uVar7]) ||
       ((0x100002600U >> ((ulong)(byte)local_48[uVar7] & 0x3f) & 1) == 0)) goto LAB_0016a2c8;
    uVar7 = uVar7 + 1;
  } while (uVar3 != (uint)uVar7);
  uVar7 = local_40 & 0xffffffff;
LAB_0016a2c8:
  uVar6 = (uint)uVar7;
  uVar5 = uVar6;
  if (uVar6 < uVar3) {
    uVar7 = uVar7 & 0xffffffff;
    do {
      if (((ulong)(byte)local_48[uVar7] < 0x21) &&
         (uVar5 = (uint)uVar7, (0x100002600U >> ((ulong)(byte)local_48[uVar7] & 0x3f) & 1) != 0))
      break;
      uVar4 = (uint)uVar7 + 1;
      uVar7 = (ulong)uVar4;
      uVar5 = uVar3;
    } while (uVar3 != uVar4);
  }
  if (uVar5 == uVar6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"FASTA error : could not parse read name from FASTA header",
               0x39);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
  }
  else {
    std::__cxx11::string::substr((ulong)local_68,(ulong)&local_48);
    pcVar2 = local_68[0];
    pcVar1 = (char *)name->_M_string_length;
    strlen(local_68[0]);
    std::__cxx11::string::_M_replace((ulong)name,0,pcVar1,(ulong)pcVar2);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0]);
    }
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return uVar5 != uVar6;
}

Assistant:

bool Fasta::FastaPrivate::GetNameFromHeader(const std::string& header, std::string& name)
{

    // get rid of the leading greater than sign
    std::string s = header.substr(1);

    // extract the first non-whitespace segment
    char* pName = (char*)s.data();
    unsigned int nameLen = (unsigned int)s.size();

    unsigned int start = 0;
    while ((pName[start] == 32) || (pName[start] == 9) || (pName[start] == 10) ||
           (pName[start] == 13)) {
        start++;
        if (start == nameLen) {
            break;
        }
    }

    unsigned int stop = start;
    if (stop < nameLen) {
        while ((pName[stop] != 32) && (pName[stop] != 9) && (pName[stop] != 10) &&
               (pName[stop] != 13)) {
            stop++;
            if (stop == nameLen) {
                break;
            }
        }
    }

    if (start == stop) {
        std::cerr << "FASTA error : could not parse read name from FASTA header" << std::endl;
        return false;
    }

    name = s.substr(start, stop - start).c_str();
    return true;
}